

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::Test::Run(Test *this)

{
  UnitTestImpl *pUVar1;
  bool bVar2;
  OsStackTraceGetterInterface *pOVar3;
  undefined **ppuVar4;
  
  bVar2 = HasSameFixtureClass();
  if (bVar2) {
    UnitTest::GetInstance();
    pUVar1 = UnitTest::GetInstance::instance.impl_;
    if ((UnitTest::GetInstance::instance.impl_)->os_stack_trace_getter_ ==
        (OsStackTraceGetterInterface *)0x0) {
      pOVar3 = (OsStackTraceGetterInterface *)operator_new(8);
      ppuVar4 = &PTR__OsStackTraceGetterInterface_001846a8;
      pOVar3->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_001846a8;
      pUVar1->os_stack_trace_getter_ = pOVar3;
    }
    else {
      ppuVar4 = (UnitTest::GetInstance::instance.impl_)->os_stack_trace_getter_->
                _vptr_OsStackTraceGetterInterface;
    }
    (*((_func_int **)ppuVar4)[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this,0x11,(char *)0x0);
    bVar2 = HasFatalFailure();
    if (!bVar2) {
      if (pUVar1->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
        pOVar3 = (OsStackTraceGetterInterface *)operator_new(8);
        ppuVar4 = &PTR__OsStackTraceGetterInterface_001846a8;
        pOVar3->_vptr_OsStackTraceGetterInterface =
             (_func_int **)&PTR__OsStackTraceGetterInterface_001846a8;
        pUVar1->os_stack_trace_getter_ = pOVar3;
      }
      else {
        ppuVar4 = pUVar1->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
      }
      (*((_func_int **)ppuVar4)[3])();
      internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this,0x21,(char *)0x0);
    }
    if (pUVar1->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
      pOVar3 = (OsStackTraceGetterInterface *)operator_new(8);
      ppuVar4 = &PTR__OsStackTraceGetterInterface_001846a8;
      pOVar3->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_001846a8;
      pUVar1->os_stack_trace_getter_ = pOVar3;
    }
    else {
      ppuVar4 = pUVar1->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
    }
    (*((_func_int **)ppuVar4)[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this,0x19,(char *)0x0);
    return;
  }
  return;
}

Assistant:

void Test::Run() {
  if (!HasSameFixtureClass()) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(this, &Test::SetUp, "SetUp()");
  // We will run the test only if SetUp() was successful.
  if (!HasFatalFailure()) {
    impl->os_stack_trace_getter()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(
        this, &Test::TestBody, "the test body");
  }

  // However, we want to clean up as much as possible.  Hence we will
  // always call TearDown(), even if SetUp() or the test body has
  // failed.
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &Test::TearDown, "TearDown()");
}